

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::operator*=(Matrix *this,Permutation *permutation)

{
  Permutation local_28;
  
  Permutation::GetInverse(&local_28,permutation);
  ApplyColumnPermutation(this,&local_28);
  if (local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

Matrix& Matrix::operator*=(const Permutation& permutation) {
  ApplyColumnPermutation(permutation.GetInverse());
  return *this;
}